

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O3

void __thiscall
rsg::BinaryVecOp<5,_true,_true,_false,_rsg::ComputeSubRange,_rsg::EvaluateSub>::BinaryVecOp
          (BinaryVecOp<5,_true,_true,_false,_rsg::ComputeSubRange,_rsg::EvaluateSub> *this,
          GeneratorState *state,Type operatorToken,ConstValueRangeAccess inValueRange)

{
  float *__src;
  int iVar1;
  Type TVar2;
  pointer pSVar3;
  pointer pSVar4;
  deRandom *rnd;
  ValueRangeAccess valueRange_00;
  ConstValueRangeAccess valueRange_01;
  ulong uVar5;
  bool bVar6;
  deUint32 dVar7;
  int iVar8;
  deUint32 dVar9;
  float fVar10;
  VariableType *pVVar11;
  float fVar12;
  uint uVar13;
  pointer pSVar14;
  pointer pSVar15;
  float *bMax;
  float *aMin;
  pointer pSVar16;
  float *__src_00;
  long lVar17;
  pointer pSVar18;
  Scalar *aMax;
  pointer pSVar19;
  pointer pSVar20;
  float *bMin;
  vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_> baseTypes;
  Type val;
  ValueRange valueRange;
  vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_> local_208;
  GeneratorState *local_1e8;
  VariableType *local_1e0;
  VariableType *local_1d8;
  long local_1d0;
  ulong local_1c8;
  VariableType *local_1c0;
  VariableType *local_1b8;
  VariableType *local_1b0;
  float *pfStack_1a8;
  float *local_1a0;
  ValueRange *local_198;
  Scalar *pSStack_190;
  Scalar *local_188;
  ValueRange local_180;
  ValueRange local_100;
  VariableType local_80;
  
  BinaryOp<5,_(rsg::Associativity)0>::BinaryOp
            (&this->super_BinaryOp<5,_(rsg::Associativity)0>,operatorToken);
  (this->super_BinaryOp<5,_(rsg::Associativity)0>).super_Expression._vptr_Expression =
       (_func_int **)&PTR__BinaryOp_0018d6f8;
  ValueRange::ValueRange(&local_100,inValueRange);
  if (local_100.m_type.m_baseType == TYPE_VOID) {
    iVar8 = state->m_shaderParams->maxExpressionDepth;
    iVar1 = state->m_expressionDepth;
    local_208.super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
    _M_impl.super__Vector_impl_data._M_start = (Type *)0x0;
    local_208.super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
    _M_impl.super__Vector_impl_data._M_finish = (Type *)0x0;
    local_208.super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (Type *)0x0;
    local_180.m_type.m_baseType = TYPE_FLOAT;
    std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>::
    _M_realloc_insert<rsg::VariableType::Type>(&local_208,(iterator)0x0,(Type *)&local_180);
    local_180.m_type.m_baseType = TYPE_INT;
    if (local_208.
        super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_208.
        super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>::
      _M_realloc_insert<rsg::VariableType::Type>
                (&local_208,
                 (iterator)
                 local_208.
                 super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(Type *)&local_180);
    }
    else {
      *local_208.
       super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>._M_impl
       .super__Vector_impl_data._M_finish = TYPE_INT;
      local_208.
      super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_208.
           super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_180.m_type.m_baseType = TYPE_VOID;
    de::Random::
    choose<__gnu_cxx::__normal_iterator<rsg::VariableType::Type*,std::vector<rsg::VariableType::Type,std::allocator<rsg::VariableType::Type>>>,rsg::VariableType::Type*>
              (state->m_random,
               (__normal_iterator<rsg::VariableType::Type_*,_std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>_>
                )local_208.
                 super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<rsg::VariableType::Type_*,_std::vector<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>_>
                )local_208.
                 super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(Type *)&local_180,1);
    TVar2 = local_180.m_type.m_baseType;
    dVar7 = deRandom_getUint32(&state->m_random->m_rnd);
    local_80.m_numElements = (dVar7 & (uint)(2 < iVar8 - iVar1) * 3) + 1;
    local_80.m_typeName._M_dataplus._M_p = (pointer)&local_80.m_typeName.field_2;
    local_80.m_baseType = TVar2;
    local_80.m_precision = PRECISION_NONE;
    local_80.m_typeName._M_string_length = 0;
    local_80.m_typeName.field_2._M_local_buf[0] = '\0';
    local_80.m_elementType = (VariableType *)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ValueRange::ValueRange(&local_180,&local_80);
    VariableType::operator=(&local_100.m_type,&local_180.m_type);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&local_100.m_min,&local_180.m_min);
    std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
              (&local_100.m_max,&local_180.m_max);
    ValueRange::~ValueRange(&local_180);
    VariableType::~VariableType(&local_80);
    pSStack_190 = local_100.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (local_100.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_100.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSStack_190 = (Scalar *)0x0;
    }
    local_188 = local_100.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_start;
    if (local_100.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_100.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_188 = (Scalar *)0x0;
    }
    valueRange_00.super_ConstValueRangeAccess.m_min = pSStack_190;
    valueRange_00.super_ConstValueRangeAccess.m_type = &local_100.m_type;
    valueRange_00.super_ConstValueRangeAccess.m_max = local_188;
    local_198 = &local_100;
    computeRandomValueRange(state,valueRange_00);
    if (local_208.
        super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>.
        _M_impl.super__Vector_impl_data._M_start != (Type *)0x0) {
      operator_delete(local_208.
                      super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_208.
                            super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.
                            super__Vector_base<rsg::VariableType::Type,_std::allocator<rsg::VariableType::Type>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  pVVar11 = &(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_type;
  VariableType::operator=(pVVar11,&local_100.m_type);
  iVar8 = VariableType::getScalarSize(pVVar11);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::resize
            (&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_value.m_value,(long)(iVar8 << 6));
  ValueRange::ValueRange(&local_180,pVVar11);
  local_1c0 = &(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange.m_type;
  VariableType::operator=(local_1c0,&local_180.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange.m_min,
             &local_180.m_min);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange.m_max,
             &local_180.m_max);
  ValueRange::~ValueRange(&local_180);
  ValueRange::ValueRange(&local_180,pVVar11);
  local_1b8 = &(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange.m_type;
  local_1e8 = state;
  VariableType::operator=(local_1b8,&local_180.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange.m_min,
             &local_180.m_min);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator=
            (&(this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange.m_max,
             &local_180.m_max);
  ValueRange::~ValueRange(&local_180);
  if (0 < (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_type.m_numElements) {
    TVar2 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_type.m_baseType;
    local_1c8 = (ulong)TVar2;
    local_1d0 = 0;
    lVar17 = 0;
    do {
      pSVar20 = local_100.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pSVar16 = local_100.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar19 = local_100.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pSVar14 = local_100.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pVVar11 = VariableType::getElementType(&local_100.m_type);
      if (pSVar16 == pSVar20) {
        pSVar16 = (Scalar *)0x0;
      }
      if (pSVar14 == pSVar19) {
        pSVar14 = (Scalar *)0x0;
      }
      pSVar19 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange.m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar20 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange.m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pSVar18 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange.m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar3 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_leftValueRange.m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_1d8 = VariableType::getElementType(local_1b8);
      if (pSVar18 == pSVar3) {
        pSVar18 = (pointer)0x0;
      }
      if (pSVar19 == pSVar20) {
        pSVar19 = (pointer)0x0;
      }
      pSVar20 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange.m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar3 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange.m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pSVar15 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange.m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar4 = (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_rightValueRange.m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_1e0 = VariableType::getElementType(local_1c0);
      uVar5 = local_1c8;
      __src = (float *)((long)pSVar14 + local_1d0);
      __src_00 = (float *)((long)pSVar16 + local_1d0);
      aMin = (float *)((long)pSVar19 + local_1d0);
      aMax = (Scalar *)((long)pSVar18 + local_1d0);
      if (pSVar15 == pSVar4) {
        pSVar15 = (pointer)0x0;
      }
      if (pSVar20 == pSVar3) {
        pSVar20 = (pointer)0x0;
      }
      bMin = (float *)((long)pSVar20 + local_1d0);
      bMax = (float *)((long)pSVar15 + local_1d0);
      if ((TVar2 - TYPE_FLOAT < 2) &&
         (valueRange_01.m_min = (Scalar *)pVVar11, valueRange_01.m_type = (VariableType *)lVar17,
         valueRange_01.m_max = aMax, local_1b0 = pVVar11, pfStack_1a8 = __src, local_1a0 = __src_00,
         bVar6 = isUndefinedValueRange(valueRange_01), bVar6)) {
        iVar8 = VariableType::getScalarSize(local_1d8);
        if (iVar8 != 0) {
          memmove(aMin,__src,(long)iVar8 << 2);
        }
        iVar8 = VariableType::getScalarSize(local_1e0);
        if (iVar8 != 0) {
          memmove(bMin,__src,(long)iVar8 << 2);
        }
        iVar8 = VariableType::getScalarSize(local_1d8);
        if (iVar8 != 0) {
          memmove(aMax,__src_00,(long)iVar8 << 2);
        }
        iVar8 = VariableType::getScalarSize(local_1e0);
        if (iVar8 != 0) {
          memmove(bMax,__src_00,(long)iVar8 << 2);
        }
      }
      else if ((int)uVar5 == 2) {
        rnd = &local_1e8->m_random->m_rnd;
        fVar10 = *__src;
        fVar12 = *__src_00;
        dVar7 = deRandom_getUint32(rnd);
        dVar9 = deRandom_getUint32(rnd);
        iVar8 = (int)fVar12 - (int)fVar10;
        uVar13 = dVar7 % (iVar8 + 1U);
        fVar12 = (float)(dVar9 % 0x11 - 8);
        fVar10 = (float)(dVar9 % 0x11 + (int)fVar10 + -8);
        *aMin = fVar10;
        aMax->intVal = (int)fVar10 + uVar13;
        *bMin = (float)(((int)fVar12 - iVar8) + uVar13);
        *bMax = fVar12;
      }
      else if ((int)uVar5 == 1) {
        ComputeSubRange::operator()
                  ((ComputeSubRange *)&local_180,local_1e8->m_random,*__src,*__src_00,aMin,
                   &aMax->floatVal,bMin,bMax);
      }
      lVar17 = lVar17 + 1;
      local_1d0 = local_1d0 + 4;
    } while (lVar17 < (this->super_BinaryOp<5,_(rsg::Associativity)0>).m_type.m_numElements);
  }
  ValueRange::~ValueRange(&local_100);
  return;
}

Assistant:

BinaryVecOp<Precedence, Float, Int, Bool, ComputeValueRange, EvaluateComp>::BinaryVecOp (GeneratorState& state, Token::Type operatorToken, ConstValueRangeAccess inValueRange)
	: BinaryOp<Precedence, ASSOCIATIVITY_LEFT>(operatorToken)
{
	ValueRange valueRange = inValueRange;

	if (valueRange.getType().isVoid())
	{
		int							availableLevels	= state.getShaderParameters().maxExpressionDepth - state.getExpressionDepth();
		vector<VariableType::Type>	baseTypes;

		if (Float)	baseTypes.push_back(VariableType::TYPE_FLOAT);
		if (Int)	baseTypes.push_back(VariableType::TYPE_INT);
		if (Bool)	baseTypes.push_back(VariableType::TYPE_BOOL);

		VariableType::Type	baseType	= state.getRandom().choose<VariableType::Type>(baseTypes.begin(), baseTypes.end());
		int					numElements	= state.getRandom().getInt(1, availableLevels >= 3 ? 4 : 1);

		valueRange = ValueRange(VariableType(baseType, numElements));
		computeRandomValueRange(state, valueRange.asAccess());
	}

	// Choose type, allocate storage for execution
	this->m_type = valueRange.getType();
	this->m_value.setStorage(this->m_type);

	// Initialize storage for value ranges
	this->m_rightValueRange	= ValueRange(this->m_type);
	this->m_leftValueRange	= ValueRange(this->m_type);

	VariableType::Type baseType = this->m_type.getBaseType();

	// Compute range for b that satisfies requested value range
	for (int elemNdx = 0; elemNdx < this->m_type.getNumElements(); elemNdx++)
	{
		ConstValueRangeAccess	dst		= valueRange.asAccess().component(elemNdx);
		ValueRangeAccess		a		= this->m_leftValueRange.asAccess().component(elemNdx); // \todo [2011-03-25 pyry] Commutative: randomize inputs
		ValueRangeAccess		b		= this->m_rightValueRange.asAccess().component(elemNdx);

		// Just pass undefined ranges
		if ((baseType == VariableType::TYPE_FLOAT || baseType == VariableType::TYPE_INT) && isUndefinedValueRange(dst))
		{
			a.getMin() = dst.getMin().value();
			b.getMin() = dst.getMin().value();
			a.getMax() = dst.getMax().value();
			b.getMax() = dst.getMax().value();
			continue;
		}

		if (baseType == VariableType::TYPE_FLOAT)
			ComputeValueRange()(state.getRandom(), dst.getMin().asFloat(), dst.getMax().asFloat(),
								a.getMin().asFloat(), a.getMax().asFloat(),
								b.getMin().asFloat(), b.getMax().asFloat());
		else if (baseType == VariableType::TYPE_INT)
			ComputeValueRange()(state.getRandom(), dst.getMin().asInt(), dst.getMax().asInt(),
								a.getMin().asInt(), a.getMax().asInt(),
								b.getMin().asInt(), b.getMax().asInt());
		else
		{
			DE_ASSERT(baseType == VariableType::TYPE_BOOL);
			ComputeValueRange()(state.getRandom(), dst.getMin().asBool(), dst.getMax().asBool(),
								a.getMin().asBool(), a.getMax().asBool(),
								b.getMin().asBool(), b.getMax().asBool());
		}
	}
}